

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint32_t __thiscall
google::protobuf::io::CodedInputStream::ReadTagFallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  byte *pbVar1;
  long lVar2;
  byte *pbVar3;
  byte v2;
  int iVar4;
  uint uVar5;
  string *psVar6;
  string *psVar7;
  int iVar8;
  uint32_t uVar10;
  long lVar11;
  byte *pbVar12;
  bool bVar13;
  LogMessage aLStack_28 [16];
  int iVar9;
  
  iVar4 = (int)this->buffer_;
  iVar9 = (int)this->buffer_end_;
  iVar8 = iVar9 - iVar4;
  if ((iVar8 < 10) && ((iVar8 < 1 || ((char)this->buffer_end_[-1] < '\0')))) {
    if ((iVar9 == iVar4) &&
       (((0 < this->buffer_size_after_limit_ || (this->total_bytes_read_ == this->current_limit_))
        && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_))))
    {
      this->legitimate_message_end_ = true;
      return 0;
    }
    uVar10 = ReadTagSlow(this);
    return uVar10;
  }
  v2 = *this->buffer_;
  if (v2 == first_byte_or_zero) {
    psVar6 = (string *)0x0;
  }
  else {
    psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,unsigned_char>
                       ((ulong)first_byte_or_zero,v2,"first_byte_or_zero == buffer_[0]");
  }
  if (psVar6 == (string *)0x0) {
    pbVar12 = this->buffer_;
    if (first_byte_or_zero == 0) {
      this->buffer_ = pbVar12 + 1;
      return 0;
    }
    if (*pbVar12 == first_byte_or_zero) {
      psVar6 = (string *)0x0;
    }
    else {
      psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_char,long>
                         (*pbVar12,(ulong)first_byte_or_zero,"*buffer == first_byte");
    }
    if (psVar6 == (string *)0x0) {
      if ((first_byte_or_zero & 0x80) == 0) {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (0,0x80,"first_byte & 0x80 == 0x80");
      }
      else {
        psVar7 = (string *)0x0;
      }
      if (psVar7 == (string *)0x0) {
        uVar10 = ((uint)pbVar12[1] * 0x80 + first_byte_or_zero) - 0x80;
        bVar13 = true;
        if ((char)pbVar12[1] < '\0') {
          uVar10 = (uVar10 + (uint)pbVar12[2] * 0x4000) - 0x4000;
          if ((char)pbVar12[2] < '\0') {
            uVar10 = (uVar10 + (uint)pbVar12[3] * 0x200000) - 0x200000;
            if ((char)pbVar12[3] < '\0') {
              uVar10 = uVar10 + (uint)pbVar12[4] * 0x10000000 + 0xf0000000;
              if ((char)pbVar12[4] < '\0') {
                pbVar1 = pbVar12 + 6;
                if ((char)pbVar12[5] < '\0') {
                  pbVar12 = pbVar12 + 10;
                  lVar11 = 0;
                  do {
                    uVar5 = (uint)lVar11;
                    if (uVar5 == 4) goto LAB_002ac2fd;
                    lVar2 = lVar11 + 1;
                    pbVar3 = pbVar1 + lVar11;
                    lVar11 = lVar2;
                  } while ((char)*pbVar3 < '\0');
                  pbVar12 = pbVar1 + lVar2;
LAB_002ac2fd:
                  bVar13 = 3 < uVar5;
                }
                else {
                  bVar13 = false;
                  pbVar12 = pbVar1;
                }
                bVar13 = (bool)(bVar13 ^ 1);
              }
              else {
                pbVar12 = pbVar12 + 5;
              }
            }
            else {
              pbVar12 = pbVar12 + 4;
            }
          }
          else {
            pbVar12 = pbVar12 + 3;
          }
        }
        else {
          pbVar12 = pbVar12 + 2;
        }
        if (bVar13) {
          this->buffer_ = pbVar12;
          return uVar10;
        }
        return 0;
      }
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)aLStack_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
                 ,0x1ae,*(undefined8 *)(psVar7 + 8),*(undefined8 *)psVar7);
      absl::lts_20240722::log_internal::LogMessage::operator<<(aLStack_28,first_byte_or_zero);
      goto LAB_002ac364;
    }
  }
  else {
    ReadTagFallback();
  }
  ReadTagFallback();
LAB_002ac364:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_28)
  ;
}

Assistant:

uint32_t CodedInputStream::ReadTagFallback(uint32_t first_byte_or_zero) {
  const int buf_size = BufferSize();
  if (buf_size >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buf_size > 0 && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_EQ(first_byte_or_zero, buffer_[0]);
    if (first_byte_or_zero == 0) {
      ++buffer_;
      return 0;
    }
    uint32_t tag;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &tag);
    if (!p.first) {
      return 0;
    }
    buffer_ = p.second;
    return tag;
  } else {
    // We are commonly at a limit when attempting to read tags. Try to quickly
    // detect this case without making another function call.
    if ((buf_size == 0) &&
        ((buffer_size_after_limit_ > 0) ||
         (total_bytes_read_ == current_limit_)) &&
        // Make sure that the limit we hit is not total_bytes_limit_, since
        // in that case we still need to call Refresh() so that it prints an
        // error.
        total_bytes_read_ - buffer_size_after_limit_ < total_bytes_limit_) {
      // We hit a byte limit.
      legitimate_message_end_ = true;
      return 0;
    }
    return ReadTagSlow();
  }
}